

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsInit(ARKodeMem ark_mem)

{
  int iVar1;
  ARKodeMem in_RDI;
  int retval;
  ARKodeARKStepMem step_mem;
  int local_1c;
  ARKodeMem ark_mem_00;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x123,"arkStep_NlsInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    ark_mem_00 = (ARKodeMem)in_RDI->step_mem;
    ark_mem_00->step_setdeltagammamax = (ARKTimestepSetDeltaGammaMax)0x0;
    ark_mem_00->step_setlsetupfrequency = (ARKTimestepSetLSetupFrequency)0x0;
    if (*(long *)&ark_mem_00->step_supports_implicit == 0) {
      local_1c = SUNNonlinSolSetLSetupFn(ark_mem_00->step_mem,0);
    }
    else {
      local_1c = SUNNonlinSolSetLSetupFn(ark_mem_00->step_mem,arkStep_NlsLSetup);
    }
    if (local_1c == 0) {
      if (ark_mem_00->step_attachlinsol == (ARKTimestepAttachLinsolFn)0x0) {
        local_1c = SUNNonlinSolSetLSolveFn(ark_mem_00->step_mem,0);
      }
      else {
        local_1c = SUNNonlinSolSetLSolveFn(ark_mem_00->step_mem,arkStep_NlsLSolve);
      }
      if (local_1c == 0) {
        iVar1 = arkStep_SetNlsSysFn(ark_mem_00);
        if (iVar1 == 0) {
          iVar1 = SUNNonlinSolInitialize(ark_mem_00->step_mem);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            arkProcessError(in_RDI,-0x16,0x153,"arkStep_NlsInit",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                            ,"The nonlinear solver\'s init routine failed.");
            local_4 = -0x1d;
          }
        }
        else {
          arkProcessError(in_RDI,-0x16,0x14a,"arkStep_NlsInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                          ,"Setting nonlinear system function failed");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,0x142,"arkStep_NlsInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                        ,"Setting linear solver solve function failed");
        local_4 = -0x1d;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,0x135,"arkStep_NlsInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                      ,"Setting the linear solver setup function failed");
      local_4 = -0x1d;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsInit(ARKodeMem ark_mem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* reset counters */
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* set the linear solver setup wrapper function */
  if (step_mem->lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, arkStep_NlsLSetup);
  }
  else { retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, NULL); }
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting the linear solver setup function failed");
    return (ARK_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (step_mem->lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, arkStep_NlsLSolve);
  }
  else { retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, NULL); }
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting linear solver solve function failed");
    return (ARK_NLS_INIT_FAIL);
  }

  retval = arkStep_SetNlsSysFn(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (ARK_ILL_INPUT);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(step_mem->NLS);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NLS_INIT_FAIL);
    return (ARK_NLS_INIT_FAIL);
  }

  return (ARK_SUCCESS);
}